

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int * Abc_FrameMiniAigReadCoArrivals(Abc_Frame_t *pAbc)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *p;
  Gia_Man_t *pGia;
  int *pArrs;
  Vec_Int_t *vArrs;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
    pAbc_local = (Abc_Frame_t *)0x0;
  }
  else {
    pGVar1 = Abc_FrameReadGia(pAbc);
    if (pGVar1 == (Gia_Man_t *)0x0) {
      printf("Current network in ABC framework is not defined.\n");
      pAbc_local = (Abc_Frame_t *)0x0;
    }
    else if (pGVar1->vCoArrs == (Vec_Int_t *)0x0) {
      printf("Current network in ABC framework has no CO arrival times.\n");
      pAbc_local = (Abc_Frame_t *)0x0;
    }
    else {
      p = Vec_IntDup(pGVar1->vCoArrs);
      pAbc_local = (Abc_Frame_t *)Vec_IntReleaseArray(p);
      Vec_IntFree(p);
    }
  }
  return (int *)pAbc_local;
}

Assistant:

int * Abc_FrameMiniAigReadCoArrivals( Abc_Frame_t * pAbc )
{
    Vec_Int_t * vArrs; int * pArrs;
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        { printf( "ABC framework is not initialized by calling Abc_Start()\n" ); return NULL; }
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        { printf( "Current network in ABC framework is not defined.\n" ); return NULL; }
    if ( pGia->vCoArrs == NULL )
        { printf( "Current network in ABC framework has no CO arrival times.\n" ); return NULL; }
    vArrs = Vec_IntDup( pGia->vCoArrs );
    pArrs = Vec_IntReleaseArray( vArrs );
    Vec_IntFree( vArrs );
    return pArrs;
}